

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O0

void Fxu_UpdateMatrixDoubleClean(Fxu_Matrix *p,Fxu_Cube *pCubeUse,Fxu_Cube *pCubeRem)

{
  Fxu_Lit *local_80;
  Fxu_Lit *local_78;
  Fxu_Lit *local_70;
  Fxu_Lit *local_68;
  Fxu_Lit *local_60;
  Fxu_Lit *local_58;
  Fxu_Lit *local_50;
  Fxu_Lit *local_48;
  Fxu_Lit *local_40;
  Fxu_Lit *bLit2Next;
  Fxu_Lit *pLit2;
  Fxu_Lit *bLit1Next;
  Fxu_Lit *pLit1;
  Fxu_Cube *pCubeRem_local;
  Fxu_Cube *pCubeUse_local;
  Fxu_Matrix *p_local;
  
  bLit1Next = (pCubeUse->lLits).pHead;
  bLit2Next = (pCubeRem->lLits).pHead;
  if (bLit1Next == (Fxu_Lit *)0x0) {
    local_48 = (Fxu_Lit *)0x0;
  }
  else {
    local_48 = bLit1Next->pHNext;
  }
  pLit2 = local_48;
  if (bLit2Next == (Fxu_Lit *)0x0) {
    local_50 = (Fxu_Lit *)0x0;
  }
  else {
    local_50 = bLit2Next->pHNext;
  }
  local_40 = local_50;
  while( true ) {
    while( true ) {
      while ((bLit1Next != (Fxu_Lit *)0x0 && (bLit2Next != (Fxu_Lit *)0x0))) {
        if (bLit1Next->iVar == bLit2Next->iVar) {
          if (bLit1Next->pVar->pOrder == (Fxu_Var *)0x0) {
            *p->ppTailVars = bLit1Next->pVar;
            p->ppTailVars = &bLit1Next->pVar->pOrder;
            bLit1Next->pVar->pOrder = (Fxu_Var *)0x1;
          }
          Fxu_MatrixDelLiteral(p,bLit2Next);
          bLit1Next = pLit2;
          bLit2Next = local_40;
          if (pLit2 == (Fxu_Lit *)0x0) {
            local_58 = (Fxu_Lit *)0x0;
          }
          else {
            local_58 = pLit2->pHNext;
          }
          pLit2 = local_58;
          if (local_40 == (Fxu_Lit *)0x0) {
            local_60 = (Fxu_Lit *)0x0;
          }
          else {
            local_60 = local_40->pHNext;
          }
          local_40 = local_60;
        }
        else if (bLit1Next->iVar < bLit2Next->iVar) {
          if (bLit1Next->pVar->pOrder == (Fxu_Var *)0x0) {
            *p->ppTailVars = bLit1Next->pVar;
            p->ppTailVars = &bLit1Next->pVar->pOrder;
            bLit1Next->pVar->pOrder = (Fxu_Var *)0x1;
          }
          Fxu_MatrixDelLiteral(p,bLit1Next);
          bLit1Next = pLit2;
          if (pLit2 == (Fxu_Lit *)0x0) {
            local_68 = (Fxu_Lit *)0x0;
          }
          else {
            local_68 = pLit2->pHNext;
          }
          pLit2 = local_68;
        }
        else {
          if (bLit2Next->pVar->pOrder == (Fxu_Var *)0x0) {
            *p->ppTailVars = bLit2Next->pVar;
            p->ppTailVars = &bLit2Next->pVar->pOrder;
            bLit2Next->pVar->pOrder = (Fxu_Var *)0x1;
          }
          Fxu_MatrixDelLiteral(p,bLit2Next);
          bLit2Next = local_40;
          if (local_40 == (Fxu_Lit *)0x0) {
            local_70 = (Fxu_Lit *)0x0;
          }
          else {
            local_70 = local_40->pHNext;
          }
          local_40 = local_70;
        }
      }
      if ((bLit1Next == (Fxu_Lit *)0x0) || (bLit2Next != (Fxu_Lit *)0x0)) break;
      if (bLit1Next->pVar->pOrder == (Fxu_Var *)0x0) {
        *p->ppTailVars = bLit1Next->pVar;
        p->ppTailVars = &bLit1Next->pVar->pOrder;
        bLit1Next->pVar->pOrder = (Fxu_Var *)0x1;
      }
      Fxu_MatrixDelLiteral(p,bLit1Next);
      bLit1Next = pLit2;
      if (pLit2 == (Fxu_Lit *)0x0) {
        local_78 = (Fxu_Lit *)0x0;
      }
      else {
        local_78 = pLit2->pHNext;
      }
      pLit2 = local_78;
    }
    if ((bLit1Next != (Fxu_Lit *)0x0) || (bLit2Next == (Fxu_Lit *)0x0)) break;
    if (bLit2Next->pVar->pOrder == (Fxu_Var *)0x0) {
      *p->ppTailVars = bLit2Next->pVar;
      p->ppTailVars = &bLit2Next->pVar->pOrder;
      bLit2Next->pVar->pOrder = (Fxu_Var *)0x1;
    }
    Fxu_MatrixDelLiteral(p,bLit2Next);
    bLit2Next = local_40;
    if (local_40 == (Fxu_Lit *)0x0) {
      local_80 = (Fxu_Lit *)0x0;
    }
    else {
      local_80 = local_40->pHNext;
    }
    local_40 = local_80;
  }
  return;
}

Assistant:

void Fxu_UpdateMatrixDoubleClean( Fxu_Matrix * p, Fxu_Cube * pCubeUse, Fxu_Cube * pCubeRem )
{
    Fxu_Lit * pLit1, * bLit1Next;
    Fxu_Lit * pLit2, * bLit2Next;

    // initialize the starting literals
    pLit1     = pCubeUse->lLits.pHead;
    pLit2     = pCubeRem->lLits.pHead;
    bLit1Next = pLit1? pLit1->pHNext: NULL;
    bLit2Next = pLit2? pLit2->pHNext: NULL;
    // go through the pair and remove the literals in the base
    // from the first cube and all literals from the second cube
    while ( 1 )
    {
        if ( pLit1 && pLit2 )
        {
            if ( pLit1->iVar == pLit2->iVar )
            {  // this literal is present in both cubes - it belongs to the base
                // mark the affected var
                if ( pLit1->pVar->pOrder == NULL )
                    Fxu_MatrixRingVarsAdd( p, pLit1->pVar );
                // leave the base in pCubeUse; delete it from pCubeRem
                Fxu_MatrixDelLiteral( p, pLit2 );
                // step to the next literals
                pLit1     = bLit1Next;
                pLit2     = bLit2Next;
                bLit1Next = pLit1? pLit1->pHNext: NULL;
                bLit2Next = pLit2? pLit2->pHNext: NULL;
            }
            else if ( pLit1->iVar < pLit2->iVar )
            { // this literal is present in pCubeUse - remove it
                // mark the affected var
                if ( pLit1->pVar->pOrder == NULL )
                    Fxu_MatrixRingVarsAdd( p, pLit1->pVar );
                // delete this literal
                Fxu_MatrixDelLiteral( p, pLit1 );
                // step to the next literals
                pLit1     = bLit1Next;
                bLit1Next = pLit1? pLit1->pHNext: NULL;
            }
            else
            { // this literal is present in pCubeRem - remove it
                // mark the affected var
                if ( pLit2->pVar->pOrder == NULL )
                    Fxu_MatrixRingVarsAdd( p, pLit2->pVar );
                // delete this literal
                Fxu_MatrixDelLiteral( p, pLit2 );
                // step to the next literals
                pLit2     = bLit2Next;
                bLit2Next = pLit2? pLit2->pHNext: NULL;
            }
        }
        else if ( pLit1 && !pLit2 )
        { // this literal is present in pCubeUse - leave it
            // mark the affected var
            if ( pLit1->pVar->pOrder == NULL )
                Fxu_MatrixRingVarsAdd( p, pLit1->pVar );
            // delete this literal
            Fxu_MatrixDelLiteral( p, pLit1 );
            // step to the next literals
            pLit1     = bLit1Next;
            bLit1Next = pLit1? pLit1->pHNext: NULL;
        }
        else if ( !pLit1 && pLit2 )
        { // this literal is present in pCubeRem - remove it
            // mark the affected var
            if ( pLit2->pVar->pOrder == NULL )
                Fxu_MatrixRingVarsAdd( p, pLit2->pVar );
            // delete this literal
            Fxu_MatrixDelLiteral( p, pLit2 );
            // step to the next literals
            pLit2     = bLit2Next;
            bLit2Next = pLit2? pLit2->pHNext: NULL;
        }
        else
            break;
    }
}